

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_simplify.c
# Opt level: O0

lua_Integer intarith(CompilerState *compiler_state,int op,lua_Integer v1,lua_Integer v2)

{
  lua_Integer v2_local;
  lua_Integer v1_local;
  int op_local;
  CompilerState *compiler_state_local;
  
  switch(op) {
  case 0:
    compiler_state_local = (CompilerState *)(v1 + v2);
    break;
  case 1:
    compiler_state_local = (CompilerState *)(v1 - v2);
    break;
  case 2:
    compiler_state_local = (CompilerState *)(v1 * v2);
    break;
  case 3:
    compiler_state_local = (CompilerState *)luaV_mod(compiler_state,v1,v2);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_simplify.c"
                  ,0x10a,"lua_Integer intarith(CompilerState *, int, lua_Integer, lua_Integer)");
  case 6:
    compiler_state_local = (CompilerState *)luaV_idiv(compiler_state,v1,v2);
    break;
  case 7:
    compiler_state_local = (CompilerState *)(v1 & v2);
    break;
  case 8:
    compiler_state_local = (CompilerState *)(v1 | v2);
    break;
  case 9:
    compiler_state_local = (CompilerState *)(v1 ^ v2);
    break;
  case 10:
    compiler_state_local = (CompilerState *)luaV_shiftl(v1,v2);
    break;
  case 0xb:
    compiler_state_local = (CompilerState *)luaV_shiftl(v1,-v2);
    break;
  case 0x16:
    compiler_state_local = (CompilerState *)-v1;
    break;
  case 0x17:
    compiler_state_local = (CompilerState *)(v1 ^ 0xffffffffffffffff);
  }
  return (lua_Integer)compiler_state_local;
}

Assistant:

static lua_Integer intarith(CompilerState *compiler_state, int op, lua_Integer v1, lua_Integer v2)
{
	switch (op) {
	case BINOPR_ADD:
		return v1 + v2;
	case BINOPR_SUB:
		return v1 - v2;
	case BINOPR_MUL:
		return v1 * v2;
	case BINOPR_MOD:
		return luaV_mod(compiler_state, v1, v2);
	case BINOPR_IDIV:
		return luaV_idiv(compiler_state, v1, v2);
	case BINOPR_BAND:
		return v1 & v2;
	case BINOPR_BOR:
		return v1 | v2;
	case BINOPR_BXOR:
		return v1 ^ v2;
	case BINOPR_SHL:
		return luaV_shiftl(v1, v2);
	case BINOPR_SHR:
		return luaV_shiftl(v1, -v2);
	case UNOPR_MINUS:
		return 0 - v1;
	case UNOPR_BNOT:
		return ~l_castS2U(0) ^ v1;
	default:
		assert(0);
		return 0;
	}
}